

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.c
# Opt level: O0

lws_mqtt_stateful_primitive_return_t lws_mqtt_str_parse(lws_mqtt_str_t *s,uint8_t **in,size_t *len)

{
  byte *pbVar1;
  uint16_t uVar2;
  uint8_t *puVar3;
  bool bVar4;
  ushort local_32;
  uint8_t *puStack_30;
  uint16_t span;
  uint8_t *oin;
  size_t *len_local;
  uint8_t **in_local;
  lws_mqtt_str_t *s_local;
  
  puStack_30 = *in;
  while( true ) {
    do {
      bVar4 = false;
      if ((*len != 0) && (bVar4 = false, s->len_valid == '\0')) {
        bVar4 = s->pos < 2;
      }
      if (!bVar4) {
        if ((s->len_valid != '\0') && (*len != 0)) {
          local_32 = s->len - s->pos;
          if (*len < (ulong)local_32) {
            local_32 = (ushort)*len;
          }
          memcpy(s->buf + (int)(uint)s->pos,*in,(ulong)local_32);
          *in = *in + (int)(uint)local_32;
          s->pos = s->pos + local_32;
        }
        *len = *len - ((long)*in - (long)puStack_30);
        bVar4 = false;
        if (s->buf != (uint8_t *)0x0) {
          bVar4 = s->pos == s->len;
        }
        return (uint)!bVar4;
      }
      uVar2 = s->len;
      pbVar1 = *in;
      *in = pbVar1 + 1;
      s->len = uVar2 << 8 | (ushort)*pbVar1;
      *len = *len - 1;
      puStack_30 = *in;
      uVar2 = s->pos + 1;
      s->pos = uVar2;
    } while (uVar2 != 2);
    if (s->limit < s->len) {
      return LMSPR_FAILED_OVERSIZE;
    }
    s->pos = 0;
    s->len_valid = '\x01';
    if (s->len == 0) break;
    if (s->buf == (uint8_t *)0x0) {
      puVar3 = (uint8_t *)lws_realloc((void *)0x0,(ulong)s->len,"lws_mqtt_str_parse");
      s->buf = puVar3;
      if (s->buf == (uint8_t *)0x0) {
        return LMSPR_FAILED_OOM;
      }
      s->needs_freeing = '\x01';
    }
  }
  return LMSPR_COMPLETED;
}

Assistant:

lws_mqtt_stateful_primitive_return_t
lws_mqtt_str_parse(lws_mqtt_str_t *s, const uint8_t **in, size_t *len)
{
	const uint8_t *oin = *in;

	/* handle the length + allocation if needed */
	while (*len && !s->len_valid && s->pos < 2) {
		s->len = (s->len << 8) | *((*in)++);
		(*len)--;
		oin = *in;
		if (++s->pos == 2) {
			if (s->len > s->limit)
				return LMSPR_FAILED_OVERSIZE;

			s->pos = 0;
			s->len_valid = 1;

			if (!s->len) /* do not need to allocate */
				return LMSPR_COMPLETED;

			if (!s->buf) {
				s->buf = lws_malloc(s->len, __func__);
				if (!s->buf)
					return LMSPR_FAILED_OOM;

				s->needs_freeing = 1;
			}
		}
	}

	/* handle copying bulk data into allocation */
	if (s->len_valid && *len) {
		uint16_t span = s->len - s->pos;

		if (span > *len)
			span = *len;

		memcpy(s->buf + s->pos, *in, span);
		*in += span;
		s->pos += span;
	}

	*len -= *in - oin;

	return s->buf && s->pos == s->len ? LMSPR_COMPLETED : LMSPR_NEED_MORE;
}